

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

int ConvexDecomposition::AssertIntact(ConvexH *convex)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uchar uVar5;
  byte bVar6;
  byte bVar7;
  short sVar8;
  uint uVar9;
  int iVar10;
  HalfEdge *pHVar11;
  Plane *pPVar12;
  float3 *pfVar13;
  float fVar14;
  undefined1 auVar15 [16];
  uint uVar16;
  ulong uVar17;
  char *__function;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [56];
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  float3 fVar29;
  
  uVar9 = (convex->edges).count;
  uVar22 = (ulong)uVar9;
  pHVar11 = (convex->edges).element;
  uVar16 = 0;
  uVar17 = 0;
  while ((~((int)uVar9 >> 0x1f) & uVar9) != uVar17) {
    if ((int)uVar9 <= (int)uVar16) goto LAB_009049df;
    uVar5 = pHVar11[uVar17].p;
    if (pHVar11[uVar16].p != uVar5) {
      uVar16 = (uint)uVar17;
    }
    uVar18 = (uint)(uVar17 + 1);
    uVar21 = uVar16;
    if (((int)uVar18 < (int)uVar9) && (pHVar11[uVar17 + 1].p == uVar5)) {
      uVar21 = uVar18;
    }
    if ((int)uVar9 <= (int)uVar21) goto LAB_009049df;
    if (pHVar11[uVar21].p != uVar5) {
      __assert_fail("convex.edges[inext].p == convex.edges[i].p",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0x6c1,"int ConvexDecomposition::AssertIntact(ConvexH &)");
    }
    sVar8 = pHVar11[uVar17].ea;
    if (sVar8 == -1) {
      return 0;
    }
    if (sVar8 == 0xff) {
      __assert_fail("nb!=255",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0x6c3,"int ConvexDecomposition::AssertIntact(ConvexH &)");
    }
    if ((sVar8 < 0) || ((int)uVar9 <= (int)sVar8)) goto LAB_009049df;
    bVar23 = uVar17 != (uint)(int)pHVar11[(uint)(int)sVar8].ea;
    uVar17 = uVar17 + 1;
    if (bVar23) {
      __assert_fail("i== convex.edges[nb].ea",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0x6c6,"int ConvexDecomposition::AssertIntact(ConvexH &)");
    }
  }
  if ((int)uVar9 < 1) {
    return 1;
  }
  pPVar12 = (convex->facets).element;
  pfVar13 = (convex->vertices).element;
  iVar10 = (convex->facets).count;
  uVar21 = (convex->vertices).count;
  auVar27 = ZEXT464(planetestepsilon);
  auVar24._8_4_ = 0x80000000;
  auVar24._0_8_ = 0x8000000080000000;
  auVar24._12_4_ = 0x80000000;
  auVar26 = ZEXT416(planetestepsilon);
  auVar24 = vxorps_avx512vl(auVar26,auVar24);
  uVar17 = 0;
LAB_00904854:
  if (uVar22 == uVar17) {
LAB_009049df:
    __function = 
    "Type &ConvexDecomposition::Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](int) [Type = ConvexDecomposition::ConvexH::HalfEdge]"
    ;
LAB_00904a82:
    __assert_fail("i>=0 && i<count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x577,__function);
  }
  bVar6 = pHVar11[uVar17].p;
  if (iVar10 <= (int)(uint)bVar6) {
    __function = 
    "Type &ConvexDecomposition::Array<ConvexDecomposition::Plane>::operator[](int) [Type = ConvexDecomposition::Plane]"
    ;
    goto LAB_00904a82;
  }
  bVar7 = pHVar11[uVar17].v;
  if ((int)(uint)bVar7 < (int)uVar21) {
    fVar2 = pPVar12[bVar6].normal.y;
    fVar3 = pPVar12[bVar6].normal.x;
    fVar4 = pPVar12[bVar6].normal.z;
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * pfVar13[bVar7].y)),ZEXT416((uint)fVar3),
                              ZEXT416((uint)pfVar13[bVar7].x));
    auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar4),ZEXT416((uint)pfVar13[bVar7].z));
    fVar14 = auVar15._0_4_ + pPVar12[bVar6].dist;
    auVar25 = (undefined1  [56])0x0;
    if ((auVar27._0_4_ < fVar14) || (fVar14 < auVar24._0_4_)) {
      __assert_fail("COPLANAR==PlaneTest(convex.facets[convex.edges[i].p],convex.vertices[convex.edges[i].v])"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0x6c9,"int ConvexDecomposition::AssertIntact(ConvexH &)");
    }
    if (uVar9 <= uVar16) goto LAB_009049df;
    uVar1 = uVar17 + 1;
    if (pHVar11[uVar16].p != bVar6) {
      uVar16 = (uint)uVar17;
    }
    uVar18 = uVar16;
    if ((uVar1 < uVar22) && (pHVar11[uVar17 + 1].p == bVar6)) {
      uVar18 = (uint)uVar1;
    }
    uVar20 = uVar18 + 1;
    if (((int)uVar9 <= (int)uVar20) || (uVar19 = (ulong)uVar20, pHVar11[uVar19].p != bVar6)) {
      uVar19 = (ulong)uVar16;
      uVar20 = uVar16;
    }
    if (uVar17 == uVar19) {
LAB_009049b8:
      uVar17 = uVar1;
      if (uVar1 == uVar22) {
        return 1;
      }
      goto LAB_00904854;
    }
    if ((int)uVar9 <= (int)uVar18) goto LAB_009049df;
    if (uVar21 <= pHVar11[uVar18].v) goto LAB_009049f9;
    if (uVar9 <= uVar20) goto LAB_009049df;
    if (pHVar11[uVar19].v < uVar21) {
      fVar29 = TriNormal(pfVar13 + bVar7,pfVar13 + pHVar11[uVar18].v,pfVar13 + pHVar11[uVar19].v);
      auVar28._4_60_ = auVar27._4_60_;
      auVar28._0_4_ = fVar29.z;
      auVar27._0_8_ = fVar29._0_8_;
      auVar27._8_56_ = auVar25;
      auVar15 = vmovshdup_avx(auVar27._0_16_);
      auVar15 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar27._0_16_,
                                ZEXT416((uint)(auVar15._0_4_ * fVar2)));
      auVar15 = vfmadd213ss_fma(ZEXT416((uint)fVar4),auVar28._0_16_,auVar15);
      auVar27 = ZEXT1664(auVar26);
      if (auVar15._0_4_ <= 0.0) {
        __assert_fail("dot(localnormal,convex.facets[convex.edges[i].p].normal)>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                      ,0x6da,"int ConvexDecomposition::AssertIntact(ConvexH &)");
      }
      goto LAB_009049b8;
    }
  }
LAB_009049f9:
  __function = 
  "Type &ConvexDecomposition::Array<ConvexDecomposition::float3>::operator[](int) [Type = ConvexDecomposition::float3]"
  ;
  goto LAB_00904a82;
}

Assistant:

int AssertIntact(ConvexH &convex) {
	int i;
	int estart=0;
	for(i=0;i<convex.edges.count;i++) {
		if(convex.edges[estart].p!= convex.edges[i].p) {
			estart=i;
		}
		int inext = i+1;
		if(inext>= convex.edges.count || convex.edges[inext].p != convex.edges[i].p) {
			inext = estart;
		}
		assert(convex.edges[inext].p == convex.edges[i].p);
		int nb = convex.edges[i].ea;
		assert(nb!=255);
		if(nb==255 || nb==-1) return 0;
		assert(nb!=-1);
		assert(i== convex.edges[nb].ea);
	}
	for(i=0;i<convex.edges.count;i++) {
		assert(COPLANAR==PlaneTest(convex.facets[convex.edges[i].p],convex.vertices[convex.edges[i].v]));
		if(COPLANAR!=PlaneTest(convex.facets[convex.edges[i].p],convex.vertices[convex.edges[i].v])) return 0;
		if(convex.edges[estart].p!= convex.edges[i].p) {
			estart=i;
		}
		int i1 = i+1;
		if(i1>= convex.edges.count || convex.edges[i1].p != convex.edges[i].p) {
			i1 = estart;
		}
		int i2 = i1+1;
		if(i2>= convex.edges.count || convex.edges[i2].p != convex.edges[i].p) {
			i2 = estart;
		}
		if(i==i2) continue; // i sliced tangent to an edge and created 2 meaningless edges
		REAL3 localnormal = TriNormal(convex.vertices[convex.edges[i ].v],
			                           convex.vertices[convex.edges[i1].v],
			                           convex.vertices[convex.edges[i2].v]);
		assert(dot(localnormal,convex.facets[convex.edges[i].p].normal)>0);
		if(dot(localnormal,convex.facets[convex.edges[i].p].normal)<=0)return 0;
	}
	return 1;
}